

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::SetPipelineState
          (DeviceContextVkImpl *this,IPipelineState *pPipelineState)

{
  uint32_t uVar1;
  PipelineStateVkImpl *this_00;
  VkPipeline pVVar2;
  PipelineStateVkImpl *this_01;
  pointer pcVar3;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> RVar4;
  DeviceContextVkImpl *pDVar5;
  bool bVar6;
  Uint32 UVar7;
  GraphicsPipelineDesc *pGVar8;
  long lVar9;
  PipelineResourceSignatureImplType *pPVar10;
  uint uVar11;
  uint *Args_1;
  DescriptorSetInfo *Args_1_00;
  byte bVar12;
  ulong uVar13;
  VkCommandBuffer pVVar14;
  Uint32 *pUVar15;
  size_type __new_size;
  DeviceContextVkImpl *pDVar16;
  bool bVar17;
  string msg;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> pOldPipeline;
  Uint32 DvpCompatibleSRBCount;
  string local_88;
  undefined8 local_68;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> local_58;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> *local_50;
  Uint32 local_44;
  DeviceContextVkImpl *local_40;
  PipelineLayoutVk *local_38;
  
  local_50 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr(&local_58,local_50);
  bVar6 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetPipelineState
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pPipelineState,
                     (INTERFACE_ID *)PipelineStateVkImpl::IID_InternalImpl);
  RVar4.m_pObject = local_58.m_pObject;
  if (!bVar6) goto LAB_001af47d;
  if (local_58.m_pObject == (PipelineStateVkImpl *)0x0) {
    bVar6 = true;
    bVar12 = 0;
  }
  else {
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&(local_58.m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    bVar17 = (((RVar4.m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) == PIPELINE_TYPE_GRAPHICS;
    bVar6 = !bVar17;
    if (bVar17) {
      pGVar8 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                         (&(local_58.m_pObject)->
                           super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      bVar12 = (pGVar8->RasterizerDesc).ScissorEnable ^ 1;
    }
    else {
      bVar12 = 0;
    }
    RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&local_58);
  }
  EnsureVkCmdBuffer(this);
  this_00 = local_50->m_pObject;
  pVVar2 = (this_00->m_Pipeline).m_VkObject;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Args_1 = &switchD_001aeeeb::switchdataD_006a3b90;
  switch((this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
         .m_Desc.PipelineType) {
  case PIPELINE_TYPE_GRAPHICS:
  case PIPELINE_TYPE_MESH:
    pGVar8 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&local_50->m_pObject->super_PipelineStateBase<Diligent::EngineVkImplTraits>)
    ;
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Args_1);
      Args_1 = (uint *)0x1a2;
      DebugAssertionFailed
                (local_88._M_dataplus._M_p,"BindGraphicsPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1a2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_CommandBuffer).m_State.GraphicsPipeline != pVVar2) {
      (*vkCmdBindPipeline)
                ((this->m_CommandBuffer).m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_GRAPHICS,pVVar2);
      (this->m_CommandBuffer).m_State.GraphicsPipeline = pVVar2;
    }
    if (bVar6) {
      uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_StencilRef;
      pVVar14 = (this->m_CommandBuffer).m_VkCmdBuffer;
      if (pVVar14 == (VkCommandBuffer)0x0) {
        FormatString<char[26],char[32]>
                  (&local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Args_1);
        Args_1 = (uint *)0x1c3;
        DebugAssertionFailed
                  (local_88._M_dataplus._M_p,"SetStencilReference",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                   ,0x1c3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pVVar14 = (this->m_CommandBuffer).m_VkCmdBuffer;
      }
      (*vkCmdSetStencilReference)(pVVar14,3,uVar1);
      pVVar14 = (this->m_CommandBuffer).m_VkCmdBuffer;
      if (pVVar14 == (VkCommandBuffer)0x0) {
        FormatString<char[26],char[32]>
                  (&local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Args_1);
        Args_1 = (uint *)0x1c9;
        DebugAssertionFailed
                  (local_88._M_dataplus._M_p,"SetBlendConstants",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                   ,0x1c9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pVVar14 = (this->m_CommandBuffer).m_VkCmdBuffer;
      }
      (*vkCmdSetBlendConstants)
                (pVVar14,(float *)(this->
                                  super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                                  m_BlendFactors);
      bVar12 = 1;
      CommitViewports(this);
    }
    if (((pGVar8->RasterizerDesc).ScissorEnable == true) && (bVar12 != 0)) {
      CommitScissorRects(this);
    }
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    bVar6 = pGVar8->NumRenderTargets == '\0' && pGVar8->pRenderPass == (IRenderPass *)0x0;
    Args_1 = (uint *)CONCAT71((int7)((ulong)Args_1 >> 8),bVar6);
    (this->m_State).NullRenderTargets = pGVar8->DSVFormat == TEX_FORMAT_UNKNOWN && bVar6;
    break;
  case PIPELINE_TYPE_COMPUTE:
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
                 (char (*) [32])&switchD_001aeeeb::switchdataD_006a3b90);
      Args_1 = (uint *)0x197;
      DebugAssertionFailed
                (local_88._M_dataplus._M_p,"BindComputePipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x197);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_CommandBuffer).m_State.ComputePipeline != pVVar2) {
      (*vkCmdBindPipeline)
                ((this->m_CommandBuffer).m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_COMPUTE,pVVar2);
      (this->m_CommandBuffer).m_State.ComputePipeline = pVVar2;
    }
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
    break;
  case PIPELINE_TYPE_RAY_TRACING:
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
                 (char (*) [32])&switchD_001aeeeb::switchdataD_006a3b90);
      Args_1 = (uint *)0x1ad;
      DebugAssertionFailed
                (local_88._M_dataplus._M_p,"BindRayTracingPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1ad);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_CommandBuffer).m_State.RayTracingPipeline != pVVar2) {
      (*vkCmdBindPipeline)
                ((this->m_CommandBuffer).m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR,pVVar2
                );
      (this->m_CommandBuffer).m_State.RayTracingPipeline = pVVar2;
    }
    (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
    break;
  case PIPELINE_TYPE_LAST:
    FormatString<char[26]>(&local_88,(char (*) [26])"Unsupported pipeline type");
    Args_1 = (uint *)0x15e;
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x15e);
    goto LAB_001af23d;
  default:
    FormatString<char[22]>(&local_88,(char (*) [22])"unknown pipeline type");
    Args_1 = (uint *)0x161;
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x161);
LAB_001af23d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = local_50->m_pObject;
  local_40 = this;
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  bVar12 = (this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
  uVar13 = (ulong)(this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc.PipelineType;
  if (uVar13 == 0xff) {
    FormatString<char[26],char[30]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Type != PIPELINE_TYPE_INVALID",(char (*) [30])Args_1);
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"GetBindInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x18d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  pDVar5 = local_40;
  local_88._M_dataplus._M_p = (Char *)0x0;
  local_88.field_2._M_allocated_capacity = 0;
  local_68 = 0;
  local_88._M_string_length = 1;
  local_88.field_2._8_8_ = 2;
  pcVar3 = (&local_88._M_dataplus)[uVar13]._M_p;
  local_44 = 0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)local_40,
             &(local_40->m_BindInfo)._M_elems[(long)pcVar3].super_CommittedShaderResources,&local_44
            );
  Args_1_00 = (DescriptorSetInfo *)(ulong)local_44;
  if (local_44 < bVar12) {
    lVar9 = (ulong)bVar12 - (long)Args_1_00;
    Args_1_00 = (pDVar5->m_BindInfo)._M_elems[(long)pcVar3].SetInfo._M_elems + (long)Args_1_00;
    do {
      (Args_1_00->vkSets)._M_elems[0] = (VkDescriptorSet_T *)0x0;
      (Args_1_00->vkSets)._M_elems[1] = (VkDescriptorSet_T *)0x0;
      Args_1_00 = (DescriptorSetInfo *)(&Args_1_00->vkSets + 2);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  (pDVar5->m_BindInfo)._M_elems[(long)pcVar3].vkPipelineLayout =
       (this_01->m_PipelineLayout).m_VkPipelineLayout.m_VkObject;
  __new_size = 0;
  pDVar16 = pDVar5;
  if ((ulong)bVar12 != 0) {
    local_38 = &this_01->m_PipelineLayout;
    pUVar15 = &(pDVar5->m_BindInfo)._M_elems[(long)pcVar3].SetInfo._M_elems[0].LastBoundBaseInd;
    uVar13 = 0;
    do {
      pPVar10 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                          (&local_50->m_pObject->
                            super_PipelineStateBase<Diligent::EngineVkImplTraits>,(uint)uVar13);
      if ((pPVar10 == (PipelineResourceSignatureImplType *)0x0) ||
         ((pPVar10->m_VkDescrSetLayouts)._M_elems[0].m_VkObject == (VkDescriptorSetLayout_T *)0x0 &&
          (pPVar10->m_VkDescrSetLayouts)._M_elems[1].m_VkObject == (VkDescriptorSetLayout_T *)0x0))
      {
        (((DescriptorSetInfo *)(pUVar15 + -6))->vkSets)._M_elems[0] = (VkDescriptorSet_T *)0x0;
        *(VkDescriptorSet_T **)(pUVar15 + -4) = (VkDescriptorSet_T *)0x0;
        *(undefined8 *)(pUVar15 + -2) = 0;
        *pUVar15 = 0xffffffff;
      }
      else {
        if (((pDVar5->m_BindInfo)._M_elems[(long)pcVar3].super_CommittedShaderResources.
             ActiveSRBMask >> ((uint)uVar13 & 0x1f) & 1) == 0) {
          FormatString<char[26],char[35]>
                    (&local_88,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"BindInfo.ActiveSRBMask & (1u << i)",(char (*) [35])Args_1_00);
          DebugAssertionFailed
                    (local_88._M_dataplus._M_p,"SetPipelineState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x180);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        UVar7 = PipelineLayoutVk::GetFirstDescrSetIndex
                          (local_38,(uint)(pPVar10->
                                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                          ).
                                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                          .m_Desc.BindingIndex);
        pUVar15[-2] = UVar7;
        uVar11 = (uint)pPVar10->m_DynamicStorageBufferCount +
                 (uint)pPVar10->m_DynamicUniformBufferCount;
        Args_1_00 = (DescriptorSetInfo *)(ulong)uVar11;
        pUVar15[-1] = uVar11;
        __new_size = (size_type)((int)__new_size + uVar11);
      }
      uVar13 = uVar13 + 1;
      pUVar15 = pUVar15 + 8;
      pDVar16 = local_40;
    } while ((uint)bVar12 != uVar13);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&pDVar16->m_DynamicBufferOffsets,__new_size);
LAB_001af47d:
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&local_58);
  return;
}

Assistant:

void DeviceContextVkImpl::SetPipelineState(IPipelineState* pPipelineState)
{
    RefCntAutoPtr<PipelineStateVkImpl> pOldPipeline = m_pPipelineState;
    if (!TDeviceContextBase::SetPipelineState(pPipelineState, PipelineStateVkImpl::IID_InternalImpl))
        return;

    bool CommitStates  = false;
    bool CommitScissor = false;
    if (!pOldPipeline)
    {
        // If no pipeline state is bound, we are working with the fresh command
        // list. We have to commit the states set in the context that are not
        // committed by the draw command (render targets, viewports, scissor rects, etc.)
        CommitStates = true;
    }
    else
    {
        const PipelineStateDesc& OldPSODesc = pOldPipeline->GetDesc();
        // Commit all graphics states when switching from non-graphics pipeline
        // This is necessary because if the command list had been flushed
        // and the first PSO set on the command list was a compute pipeline,
        // the states would otherwise never be committed (since m_pPipelineState != nullptr)
        CommitStates = !OldPSODesc.IsAnyGraphicsPipeline();
        // We also need to update scissor rect if ScissorEnable state was disabled in previous pipeline
        if (OldPSODesc.IsAnyGraphicsPipeline())
            CommitScissor = !pOldPipeline->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable;
        pOldPipeline.Release();
    }

    EnsureVkCmdBuffer();

    const VkPipeline         vkPipeline = m_pPipelineState->GetVkPipeline();
    const PipelineStateDesc& PSODesc    = m_pPipelineState->GetDesc();

    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PSODesc.PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
        case PIPELINE_TYPE_MESH:
        {
            const GraphicsPipelineDesc& GraphicsPipeline = m_pPipelineState->GetGraphicsPipelineDesc();
            m_CommandBuffer.BindGraphicsPipeline(vkPipeline);

            if (CommitStates)
            {
                m_CommandBuffer.SetStencilReference(m_StencilRef);
                m_CommandBuffer.SetBlendConstants(m_BlendFactors);
                CommitViewports();
            }

            if (GraphicsPipeline.RasterizerDesc.ScissorEnable && (CommitStates || CommitScissor))
            {
                CommitScissorRects();
            }
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

            m_State.NullRenderTargets =
                GraphicsPipeline.pRenderPass == nullptr &&
                GraphicsPipeline.NumRenderTargets == 0 &&
                GraphicsPipeline.DSVFormat == TEX_FORMAT_UNKNOWN;
            break;
        }
        case PIPELINE_TYPE_COMPUTE:
        {
            m_CommandBuffer.BindComputePipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
            break;
        }
        case PIPELINE_TYPE_RAY_TRACING:
        {
            m_CommandBuffer.BindRayTracingPipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
            break;
        }
        case PIPELINE_TYPE_TILE:
            UNEXPECTED("Unsupported pipeline type");
            break;
        default:
            UNEXPECTED("unknown pipeline type");
    }

    const PipelineLayoutVk& Layout    = m_pPipelineState->GetPipelineLayout();
    const Uint32            SignCount = m_pPipelineState->GetResourceSignatureCount();
    ResourceBindInfo&       BindInfo  = GetBindInfo(PSODesc.PipelineType);

    Uint32 DvpCompatibleSRBCount = 0;
    PrepareCommittedResources(BindInfo, DvpCompatibleSRBCount);
#ifdef DILIGENT_DEVELOPMENT
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        // Do not clear DescriptorSetBaseInd and DynamicOffsetCount!
        BindInfo.SetInfo[sign].vkSets.fill(VK_NULL_HANDLE);
    }
#endif

    BindInfo.vkPipelineLayout = Layout.GetVkPipelineLayout();

    Uint32 TotalDynamicOffsetCount = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];

        PipelineResourceSignatureVkImpl* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetNumDescriptorSets() == 0)
        {
            SetInfo = {};
            continue;
        }

        VERIFY_EXPR(BindInfo.ActiveSRBMask & (1u << i));

        SetInfo.BaseInd            = Layout.GetFirstDescrSetIndex(pSignature->GetDesc().BindingIndex);
        SetInfo.DynamicOffsetCount = pSignature->GetDynamicOffsetCount();
        TotalDynamicOffsetCount += SetInfo.DynamicOffsetCount;
    }

    // Reserve space to store all dynamic buffer offsets
    m_DynamicBufferOffsets.resize(TotalDynamicOffsetCount);
}